

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void __thiscall
Js::JavascriptNativeFloatArray::JavascriptNativeFloatArray
          (JavascriptNativeFloatArray *this,DynamicType *type,uint32 size)

{
  SparseArraySegmentBase *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DynamicTypeHandler *pDVar5;
  ulong uVar6;
  
  JavascriptArray::JavascriptArray((JavascriptArray *)this,type);
  (this->super_JavascriptNativeArray).weakRefToFuncBody.ptr =
       (RecyclerWeakReference<Js::FunctionBody> *)0x0;
  (this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_0150d6f0;
  if (((undefined **)VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address !=
       &PTR_Finalize_0150d6f0) &&
     ((undefined **)VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeFloatArray>_>::Address
      != &PTR_Finalize_0150d6f0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                ,0x76c,
                                "(VirtualTableInfo<T>::HasVirtualTable(array) || VirtualTableInfo<CrossSiteObject<T>>::HasVirtualTable(array))"
                                ,
                                "VirtualTableInfo<T>::HasVirtualTable(array) || VirtualTableInfo<CrossSiteObject<T>>::HasVirtualTable(array)"
                               );
    if (!bVar3) goto LAB_00b79961;
    *puVar4 = 0;
  }
  pDVar5 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  if (pDVar5->inlineSlotCapacity != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                ,0x770,
                                "(UseDynamicInlinePropertySlots || ConstInlinePropertySlots == array->GetTypeHandler()->GetInlineSlotCapacity())"
                                ,
                                "UseDynamicInlinePropertySlots || ConstInlinePropertySlots == array->GetTypeHandler()->GetInlineSlotCapacity()"
                               );
    if (!bVar3) {
LAB_00b79961:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  JavascriptArray::SetHeadAndLastUsedSegment
            ((JavascriptArray *)this,(SparseArraySegmentBase *)(this + 1));
  pSVar1 = (this->super_JavascriptNativeArray).super_JavascriptArray.head.ptr;
  pSVar1->size = size;
  SparseArraySegmentBase::CheckLengthvsSize(pSVar1);
  if (size != 0) {
    pSVar1 = (this->super_JavascriptNativeArray).super_JavascriptArray.head.ptr;
    uVar6 = 0;
    do {
      *(undefined1 **)(&pSVar1[1].left + uVar6 * 2) = &DAT_fff80002fff80002;
      uVar6 = uVar6 + 1;
    } while (size != uVar6);
  }
  return;
}

Assistant:

JavascriptNativeFloatArray::JavascriptNativeFloatArray(DynamicType * type, uint32 size)
        : JavascriptNativeArray(type)
    {
        SetHeadAndLastUsedSegment(DetermineInlineHeadSegmentPointer<JavascriptNativeFloatArray, 0, false>(this));
        head->size = size;
        head->CheckLengthvsSize();
        SparseArraySegment<double>::From(head)->FillSegmentBuffer(0, size);
    }